

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pwm.c
# Opt level: O0

float mraa_pwm_read(mraa_pwm_context dev)

{
  int iVar1;
  int iVar2;
  int period;
  mraa_pwm_context dev_local;
  
  if (dev == (mraa_pwm_context)0x0) {
    syslog(3,"pwm: read: context is NULL");
    dev_local._4_4_ = 5.0;
  }
  else {
    iVar1 = mraa_pwm_read_period(dev);
    if (iVar1 < 1) {
      dev_local._4_4_ = 0.0;
    }
    else {
      iVar2 = mraa_pwm_read_duty(dev);
      dev_local._4_4_ = (float)iVar2 / (float)iVar1;
    }
  }
  return dev_local._4_4_;
}

Assistant:

float
mraa_pwm_read(mraa_pwm_context dev)
{
    if (!dev) {
        syslog(LOG_ERR, "pwm: read: context is NULL");
        return MRAA_ERROR_INVALID_HANDLE;
    }

    int period = mraa_pwm_read_period(dev);
    if (period > 0) {
        return (mraa_pwm_read_duty(dev) / (float) period);
    }
    return 0.0f;
}